

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void reclaim_rollback_point_test(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  void *value_out;
  char keybuf [16];
  size_t valuelen_out;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  
  memleak_start();
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  fconfig.compaction_threshold = '\0';
  fconfig.num_keeping_headers = 5;
  fVar3 = fdb_open(&dbfile,"./staleblktest1",&fconfig);
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar5 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x688);
    reclaim_rollback_point_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x688,"void reclaim_rollback_point_test()");
  }
  fVar3 = fdb_kvs_open(dbfile,&db,"db",&kvs_config);
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar5 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x68a);
    reclaim_rollback_point_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x68a,"void reclaim_rollback_point_test()");
  }
  uVar6 = 0;
  while (uVar6 != 30000) {
    sprintf(keybuf,"key%d",(ulong)uVar6);
    pfVar2 = db;
    sVar4 = strlen(keybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar4,"reu",4);
    pFVar1 = _stderr;
    uVar6 = uVar6 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar5 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x693);
      reclaim_rollback_point_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x693,"void reclaim_rollback_point_test()");
    }
  }
  fVar3 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar5 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x696);
    reclaim_rollback_point_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x696,"void reclaim_rollback_point_test()");
  }
  do {
    fVar3 = fdb_set_kv(db,"key",4,"val",4);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar5 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x69d);
      reclaim_rollback_point_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x69d,"void reclaim_rollback_point_test()");
    }
    fVar3 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar5 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x6a0);
      reclaim_rollback_point_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6a0,"void reclaim_rollback_point_test()");
    }
  } while (file_info.file_size < 0x1000001);
  fVar3 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar5 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x6a4);
    reclaim_rollback_point_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6a4,"void reclaim_rollback_point_test()");
  }
  uVar6 = 0;
  while (uVar6 != 30000) {
    sprintf(keybuf,"key%d",(ulong)uVar6);
    pfVar2 = db;
    sVar4 = strlen(keybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar4,"reu2",5);
    pFVar1 = _stderr;
    uVar6 = uVar6 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar5 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x6aa);
      reclaim_rollback_point_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6aa,"void reclaim_rollback_point_test()");
    }
  }
  fVar3 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar5 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x6ad);
    reclaim_rollback_point_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6ad,"void reclaim_rollback_point_test()");
  }
  fVar3 = fdb_rollback(&db,30000);
  pFVar1 = _stderr;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    for (uVar6 = 0; uVar6 != 30000; uVar6 = uVar6 + 1) {
      sprintf(keybuf,"key%d",(ulong)uVar6);
      pfVar2 = db;
      sVar4 = strlen(keybuf);
      fVar3 = fdb_get_kv(pfVar2,keybuf,sVar4,&value_out,&valuelen_out);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar5 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6b7);
        reclaim_rollback_point_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x6b7,"void reclaim_rollback_point_test()");
      }
      free(value_out);
    }
    uVar6 = 0;
    do {
      if (uVar6 == 5) {
        iVar7 = 0x7531;
        while (iVar7 = iVar7 + -1, iVar7 != 0) {
          fVar3 = fdb_set_kv(db,"key",4,"val",4);
          pFVar1 = _stderr;
          if (fVar3 != FDB_RESULT_SUCCESS) {
            pcVar5 = fdb_error_msg(fVar3);
            fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                    pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6c8);
            reclaim_rollback_point_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                          ,0x6c8,"void reclaim_rollback_point_test()");
          }
        }
        fVar3 = fdb_commit(dbfile,'\x01');
        pFVar1 = _stderr;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pcVar5 = fdb_error_msg(fVar3);
          fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6cb);
          reclaim_rollback_point_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x6cb,"void reclaim_rollback_point_test()");
        }
        iVar7 = 0x7531;
        while (iVar7 = iVar7 + -1, iVar7 != 0) {
          fVar3 = fdb_set_kv(db,"key",4,"val",4);
          pFVar1 = _stderr;
          if (fVar3 != FDB_RESULT_SUCCESS) {
            pcVar5 = fdb_error_msg(fVar3);
            fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                    pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6d0);
            reclaim_rollback_point_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                          ,0x6d0,"void reclaim_rollback_point_test()");
          }
        }
        fVar3 = fdb_commit(dbfile,'\x01');
        pFVar1 = _stderr;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pcVar5 = fdb_error_msg(fVar3);
          fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6d3);
          reclaim_rollback_point_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x6d3,"void reclaim_rollback_point_test()");
        }
        for (uVar6 = 0; uVar6 != 30000; uVar6 = uVar6 + 1) {
          sprintf(keybuf,"key%d",(ulong)uVar6);
          pfVar2 = db;
          sVar4 = strlen(keybuf);
          fVar3 = fdb_get_kv(pfVar2,keybuf,sVar4,&value_out,&valuelen_out);
          pFVar1 = _stderr;
          if (fVar3 != FDB_RESULT_SUCCESS) {
            pcVar5 = fdb_error_msg(fVar3);
            fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                    pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6d9);
            reclaim_rollback_point_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                          ,0x6d9,"void reclaim_rollback_point_test()");
          }
          free(value_out);
        }
        fVar3 = fdb_kvs_close(db);
        pFVar1 = _stderr;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pcVar5 = fdb_error_msg(fVar3);
          fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6de);
          reclaim_rollback_point_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x6de,"void reclaim_rollback_point_test()");
        }
        fVar3 = fdb_close(dbfile);
        pFVar1 = _stderr;
        if (fVar3 == FDB_RESULT_SUCCESS) {
          fdb_shutdown();
          memleak_end();
          pcVar5 = "%s PASSED\n";
          if (reclaim_rollback_point_test()::__test_pass != '\0') {
            pcVar5 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar5,"reclaim rollback point test");
          return;
        }
        pcVar5 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6e0);
        reclaim_rollback_point_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x6e0,"void reclaim_rollback_point_test()");
      }
      sprintf(keybuf,"key%d",(ulong)uVar6);
      pfVar2 = db;
      sVar4 = strlen(keybuf);
      fVar3 = fdb_set_kv(pfVar2,keybuf,sVar4,"reu",4);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar5 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6bf);
        reclaim_rollback_point_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x6bf,"void reclaim_rollback_point_test()");
      }
      fVar3 = fdb_commit(dbfile,'\x01');
      pFVar1 = _stderr;
      uVar6 = uVar6 + 1;
    } while (fVar3 == FDB_RESULT_SUCCESS);
    pcVar5 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x6c1);
    reclaim_rollback_point_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6c1,"void reclaim_rollback_point_test()");
  }
  pcVar5 = fdb_error_msg(fVar3);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar5,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x6b1);
  reclaim_rollback_point_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6b1,"void reclaim_rollback_point_test()");
}

Assistant:

void reclaim_rollback_point_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=5;
    int ndocs=30000;
    char keybuf[16];

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    void *value_out;
    size_t valuelen_out;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load n docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // overwrite n docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu2", 5);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // rollback to the first commit
    status = fdb_rollback(&db, low_seq);
    TEST_STATUS(status);

    // retrieve docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value_out, &valuelen_out);
        TEST_STATUS(status);
        free(value_out);
    }

    // create nheaders
    for (i = 0; i < nheaders; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // append some data & commit
    // now old blocks will be reclaimed
    for (i=0; i<ndocs; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // append more data .. now reusable blocks are overwritten
    for (i=0; i<ndocs; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // retrieve docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value_out, &valuelen_out);
        TEST_STATUS(status);
        free(value_out);
    }

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("reclaim rollback point test");
}